

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

string * get_description_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *node)

{
  bool bVar1;
  int __val;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_1a;
  undefined1 local_19;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *node_local;
  string *result;
  
  local_19 = 0;
  local_18 = node;
  node_local = (QPDFObjectHandle *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Name/Number tree node",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  bVar1 = QPDFObjectHandle::isIndirect(local_18);
  if (bVar1) {
    __val = QPDFObjectHandle::getObjectID(local_18);
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_70," (object ",&local_90);
    std::operator+(&local_50,&local_70,")");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
get_description(QPDFObjectHandle& node)
{
    std::string result("Name/Number tree node");
    if (node.isIndirect()) {
        result += " (object " + std::to_string(node.getObjectID()) + ")";
    }
    return result;
}